

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O2

void reset_sigchld(void)

{
  __sighandler_t p_Var1;
  ContextManager *pCVar2;
  string local_30;
  
  p_Var1 = signal(0x11,(__sighandler_t)0x0);
  if (p_Var1 == (__sighandler_t)0xffffffffffffffff) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to set SIGCHLD sigaction to SIG_DFL: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void reset_sigchld() {
    if (signal(SIGCHLD, SIG_DFL) == SIG_ERR) {
        die(format("Failed to set SIGCHLD sigaction to SIG_DFL: %m"));
    }
}